

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

optional<wasm::WATParser::(anonymous_namespace)::LexStrResult> * __thiscall
wasm::WATParser::anon_unknown_0::LexStrCtx::lexed
          (optional<wasm::WATParser::(anonymous_namespace)::LexStrResult> *__return_storage_ptr__,
          LexStrCtx *this)

{
  bool bVar1;
  LexResult *pLVar2;
  LexStrResult local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  LexStrResult local_68;
  undefined1 local_30 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexResult> basic;
  LexStrCtx *this_local;
  
  basic.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
  _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>._16_8_
       = this;
  LexCtx::lexed((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)local_30,
                &this->super_LexCtx);
  bVar1 = std::optional::operator_cast_to_bool((optional *)local_30);
  if (bVar1) {
    bVar1 = std::optional::operator_cast_to_bool((optional *)&this->escapeBuilder);
    if (bVar1) {
      pLVar2 = std::optional<wasm::WATParser::(anonymous_namespace)::LexResult>::operator*
                         ((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)local_30);
      local_68.super_LexResult.span._M_len = (pLVar2->span)._M_len;
      local_68.super_LexResult.span._M_str = (pLVar2->span)._M_str;
      std::
      optional<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator->(&this->escapeBuilder);
      std::__cxx11::stringstream::str();
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (&local_68.str,&local_88);
      std::optional<wasm::WATParser::(anonymous_namespace)::LexStrResult>::
      optional<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true>
                (__return_storage_ptr__,&local_68);
      LexStrResult::~LexStrResult(&local_68);
      std::__cxx11::string::~string((string *)&local_88);
    }
    else {
      pLVar2 = std::optional<wasm::WATParser::(anonymous_namespace)::LexResult>::operator*
                         ((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)local_30);
      local_c0.super_LexResult.span._M_len = (pLVar2->span)._M_len;
      local_c0.super_LexResult.span._M_str = (pLVar2->span)._M_str;
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional(&local_c0.str);
      std::optional<wasm::WATParser::(anonymous_namespace)::LexStrResult>::
      optional<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true>
                (__return_storage_ptr__,&local_c0);
      LexStrResult::~LexStrResult(&local_c0);
    }
  }
  else {
    std::optional<wasm::WATParser::(anonymous_namespace)::LexStrResult>::optional
              (__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<LexStrResult> lexed() {
    if (auto basic = LexCtx::lexed()) {
      if (escapeBuilder) {
        return LexStrResult{*basic, {escapeBuilder->str()}};
      } else {
        return LexStrResult{*basic, {}};
      }
    }
    return {};
  }